

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.c
# Opt level: O0

int mapOceanMixMod(Layer *l,int *out,int x,int z,int w,int h)

{
  int id;
  int iVar1;
  void *__dest;
  undefined4 in_ECX;
  undefined4 in_EDX;
  void *in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int oceanID;
  int landID;
  int64_t j;
  int64_t i;
  int *otyp;
  undefined4 local_40;
  undefined8 local_38;
  undefined8 local_30;
  
  (*(code *)**(undefined8 **)(in_RDI + 0x40))
            (*(undefined8 *)(in_RDI + 0x40),in_RSI,in_EDX,in_ECX,in_R8D,in_R9D);
  __dest = malloc((long)(in_R8D * in_R9D) << 2);
  memcpy(__dest,in_RSI,(long)(in_R8D * in_R9D) << 2);
  (*(code *)**(undefined8 **)(in_RDI + 0x38))
            (*(undefined8 *)(in_RDI + 0x38),in_RSI,in_EDX,in_ECX,in_R8D,in_R9D);
  for (local_38 = 0; local_38 < in_R9D; local_38 = local_38 + 1) {
    for (local_30 = 0; local_30 < in_R8D; local_30 = local_30 + 1) {
      id = *(int *)((long)in_RSI + (local_38 * in_R8D + local_30) * 4);
      iVar1 = isOceanic(id);
      if (iVar1 != 0) {
        local_40 = *(int *)((long)__dest + (local_38 * in_R8D + local_30) * 4);
        if (id == 0x18) {
          if (local_40 == 0) {
            local_40 = 0x18;
          }
          else if (local_40 == 10) {
            local_40 = 0x32;
          }
          else if (local_40 == 0x2d) {
            local_40 = 0x30;
          }
          else if (local_40 == 0x2e) {
            local_40 = 0x31;
          }
        }
        *(int *)((long)in_RSI + (local_38 * in_R8D + local_30) * 4) = local_40;
      }
    }
  }
  free(__dest);
  return 0;
}

Assistant:

int mapOceanMixMod(const Layer * l, int * out, int x, int z, int w, int h)
{
    int *otyp;
    int64_t i, j;
    l->p2->getMap(l->p2, out, x, z, w, h);

    otyp = (int *) malloc(w*h*sizeof(int));
    memcpy(otyp, out, w*h*sizeof(int));

    l->p->getMap(l->p, out, x, z, w, h);


    for (j = 0; j < h; j++)
    {
        for (i = 0; i < w; i++)
        {
            int landID, oceanID;

            landID = out[j*w + i];

            if (!isOceanic(landID))
                continue;

            oceanID = otyp[j*w + i];

            if (landID == deep_ocean)
            {
                switch (oceanID)
                {
                case lukewarm_ocean:
                    oceanID = deep_lukewarm_ocean;
                    break;
                case ocean:
                    oceanID = deep_ocean;
                    break;
                case cold_ocean:
                    oceanID = deep_cold_ocean;
                    break;
                case frozen_ocean:
                    oceanID = deep_frozen_ocean;
                    break;
                }
            }

            out[j*w + i] = oceanID;
        }
    }

    free(otyp);

    return 0;
}